

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O3

void __thiscall TPZString::Append(TPZString *this,char TailIncrement)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  
  lVar1 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
          fNElements;
  if (lVar1 == 0) {
    lVar3 = 0;
  }
  else {
    sVar2 = strlen((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                   fStore);
    lVar3 = sVar2 << 0x20;
  }
  if (lVar1 < lVar3 + 0x200000000 >> 0x20) {
    TPZStack<char,_10>::Push(&this->super_TPZStack<char,_10>,'\0');
  }
  else {
    (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore
    [lVar3 + 0x100000000 >> 0x20] = '\0';
  }
  (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore
  [lVar3 >> 0x20] = TailIncrement;
  return;
}

Assistant:

void TPZString::Append(const char TailIncrement)
{
	int len = Length();
	// if the allocated memory is less than the length +1 (null char)
	// +1 (new char), reallocates it
	if (fNElements < len + 2)
	{
		Push('\0');
	}
	else
	{
		fStore[len + 1] = '\0';
	}
	
	fStore[len] = TailIncrement;
}